

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

void __thiscall QDialog::keyPressEvent(QDialog *this,QKeyEvent *e)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  ulong uVar4;
  long i_00;
  qsizetype qVar5;
  QKeyEvent *in_RSI;
  QAbstractButton *in_RDI;
  long in_FS_OFFSET;
  QPushButton *pb;
  int i;
  QList<QPushButton_*> list;
  undefined8 in_stack_ffffffffffffff88;
  FindChildOption flags;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_4c;
  QFlagsStorage<Qt::FindChildOption> in_stack_ffffffffffffffcc;
  QList<QPushButton_*> local_30;
  undefined4 local_14;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_10;
  QFlagsStorage<Qt::KeyboardModifier> local_c;
  long local_8;
  
  flags = (FindChildOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = QKeyEvent::matches((StandardKey)in_RSI);
  if ((uVar4 & 1) == 0) {
    local_c.i = QKeyEvent::modifiers();
    bVar1 = QFlags<Qt::KeyboardModifier>::operator!((QFlags<Qt::KeyboardModifier> *)&local_c);
    uVar6 = true;
    if (!bVar1) {
      local_14 = QKeyEvent::modifiers();
      local_10.super_QFlagsStorage<Qt::KeyboardModifier>.i =
           (QFlagsStorage<Qt::KeyboardModifier>)
           QFlags<Qt::KeyboardModifier>::operator&
                     ((QFlags<Qt::KeyboardModifier> *)
                      CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                      flags);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_10);
      in_stack_ffffffffffffff96 = false;
      uVar6 = in_stack_ffffffffffffff96;
      if (IVar2 != 0) {
        iVar3 = QKeyEvent::key(in_RSI);
        in_stack_ffffffffffffff96 = iVar3 == 0x1000005;
        uVar6 = in_stack_ffffffffffffff96;
      }
    }
    if ((bool)uVar6 == false) {
      QEvent::ignore((QEvent *)in_RSI);
    }
    else {
      iVar3 = QKeyEvent::key(in_RSI);
      if (iVar3 == 0x1000004 || iVar3 == 0x1000005) {
        local_30.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_30.d.ptr = (QPushButton **)&DAT_aaaaaaaaaaaaaaaa;
        local_30.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QFlags<Qt::FindChildOption>::QFlags
                  ((QFlags<Qt::FindChildOption> *)
                   CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                   flags);
        QObject::findChildren<QPushButton*>
                  ((QObject *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (FindChildOptions)in_stack_ffffffffffffffcc.i);
        local_4c = 0;
        while( true ) {
          i_00 = (long)local_4c;
          qVar5 = QList<QPushButton_*>::size(&local_30);
          if (qVar5 <= i_00) break;
          QList<QPushButton_*>::at
                    ((QList<QPushButton_*> *)
                     CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                     i_00);
          bVar1 = QPushButton::isDefault
                            ((QPushButton *)
                             CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff96,
                                                     in_stack_ffffffffffffff90)));
          if ((bVar1) && (bVar1 = QWidget::isVisible((QWidget *)0x7445e2), bVar1)) {
            bVar1 = QWidget::isEnabled((QWidget *)0x7445f2);
            if (bVar1) {
              QAbstractButton::click(in_RDI);
            }
            break;
          }
          local_4c = local_4c + 1;
        }
        QList<QPushButton_*>::~QList((QList<QPushButton_*> *)0x744630);
      }
      else {
        QEvent::ignore((QEvent *)in_RSI);
      }
    }
  }
  else {
    (**(code **)(*(long *)&in_RDI->super_QWidget + 0x1c0))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::keyPressEvent(QKeyEvent *e)
{
#ifndef QT_NO_SHORTCUT
    //   Calls reject() if Escape is pressed. Simulates a button
    //   click for the default button if Enter is pressed. Move focus
    //   for the arrow keys. Ignore the rest.
    if (e->matches(QKeySequence::Cancel)) {
        reject();
    } else
#endif
    if (!e->modifiers() || (e->modifiers() & Qt::KeypadModifier && e->key() == Qt::Key_Enter)) {
        switch (e->key()) {
#if QT_CONFIG(pushbutton)
        case Qt::Key_Enter:
        case Qt::Key_Return: {
            QList<QPushButton*> list = findChildren<QPushButton*>();
            for (int i=0; i<list.size(); ++i) {
                QPushButton *pb = list.at(i);
                if (pb->isDefault() && pb->isVisible()) {
                    if (pb->isEnabled())
                        pb->click();
                    return;
                }
            }
        }
        break;
#endif
        default:
            e->ignore();
            return;
        }
    } else {
        e->ignore();
    }
}